

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O2

vector_type * __thiscall
Disa::Vector_Dense<double,0ul>::operator-=
          (Vector_Dense<double,0ul> *this,Vector_Dense<double,_0UL> *vector)

{
  long lVar1;
  pointer pdVar2;
  ostream *poVar3;
  source_location *location;
  long lVar4;
  string sStack_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lVar1 = *(long *)this;
  location = (source_location *)(*(long *)(this + 8) - lVar1);
  pdVar2 = (vector->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (location ==
      (source_location *)
      ((long)(vector->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish - (long)pdVar2)) {
    for (lVar4 = 0; (long)location >> 3 != lVar4; lVar4 = lVar4 + 1) {
      *(double *)(lVar1 + lVar4 * 8) = *(double *)(lVar1 + lVar4 * 8) - pdVar2[lVar4];
    }
    return (vector_type *)this;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
  local_48 = &PTR_s__workspace_llm4binary_github_lic_00172358;
  console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,location);
  poVar3 = std::operator<<(poVar3,(string *)&local_40);
  std::__cxx11::to_string(&local_e8,*(long *)(this + 8) - *(long *)this >> 3);
  std::operator+(&local_c8,"Incompatible vector sizes, ",&local_e8);
  std::operator+(&local_a8,&local_c8," vs. ");
  std::__cxx11::to_string
            (&sStack_108,
             (long)(vector->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(vector->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_88,&local_a8,&sStack_108);
  std::operator+(&local_68,&local_88,".");
  poVar3 = std::operator<<(poVar3,(string *)&local_68);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&sStack_108);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_40);
  exit(1);
}

Assistant:

constexpr vector_type& operator-=(const Vector_Dense<_type, _size_other>& vector) {
    ASSERT_DEBUG(this->size() == vector.size(), "Incompatible vector sizes, " + std::to_string(this->size()) + " vs. " +
                                                std::to_string(vector.size()) + ".");
    FOR(index, this->size())(*this)[index] -= vector[index];
    return *this;
  }